

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Cluster::AddMetadata
          (Cluster *this,uint8_t *data,uint64_t length,uint64_t track_number,uint64_t abs_timecode,
          uint64_t duration_timecode)

{
  bool bVar1;
  uint64_t in_RCX;
  Frame *in_RDI;
  uint64_t in_R8;
  uint64_t in_R9;
  Frame *in_stack_00000010;
  Cluster *in_stack_00000018;
  Frame frame;
  uint64_t in_stack_ffffffffffffff38;
  Frame *this_00;
  Frame *in_stack_ffffffffffffff48;
  Frame local_a0;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  bool local_1;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  Frame::Frame(&local_a0);
  bVar1 = Frame::Init(in_stack_ffffffffffffff48,(uint8_t *)in_RDI,in_stack_ffffffffffffff38);
  if (bVar1) {
    Frame::set_track_number(&local_a0,local_28);
    Frame::set_timestamp(&local_a0,local_30);
    this_00 = &local_a0;
    Frame::set_duration(this_00,local_38);
    Frame::set_is_key(this_00,true);
    local_1 = QueueOrWriteFrame(in_stack_00000018,in_stack_00000010);
  }
  else {
    local_1 = false;
  }
  Frame::~Frame(in_RDI);
  return (bool)(local_1 & 1);
}

Assistant:

bool Cluster::AddMetadata(const uint8_t* data, uint64_t length,
                          uint64_t track_number, uint64_t abs_timecode,
                          uint64_t duration_timecode) {
  Frame frame;
  if (!frame.Init(data, length))
    return false;
  frame.set_track_number(track_number);
  frame.set_timestamp(abs_timecode);
  frame.set_duration(duration_timecode);
  frame.set_is_key(true);  // All metadata blocks are keyframes.
  return QueueOrWriteFrame(&frame);
}